

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

void __thiscall TextButton::TextButton(TextButton *this)

{
  Vector2f local_28;
  
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001d19b0;
  sf::Transformable::Transformable(&(this->super_UIComponent).super_Transformable);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 1;
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextButton_001d2120;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__TextButton_001d2158;
  sf::Text::Text(&this->text);
  local_28.x = 0.0;
  local_28.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->button,&local_28);
  sf::Color::Color(&this->color1);
  sf::Color::Color(&this->color2);
  (this->action).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->action)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->action).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->action).super__Function_base._M_functor + 8) = 0;
  return;
}

Assistant:

TextButton::TextButton() {}